

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char *__beg;
  bool bVar1;
  CommentInfo *pCVar2;
  ulong local_170;
  bool local_162;
  bool local_161;
  Value local_158;
  Value local_130;
  Value local_108;
  uint local_e0;
  UInt digit;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char local_61;
  ulong uStack_60;
  Char c;
  LargestUInt value;
  LargestUInt threshold;
  LargestUInt maxIntegerValue;
  CommentInfo *pCStack_40;
  bool isNegative;
  Location current;
  Location inspect;
  Value *pVStack_28;
  bool isDouble;
  Value *decoded_local;
  Token *token_local;
  Reader *this_local;
  
  inspect._7_1_ = false;
  pVStack_28 = decoded;
  decoded_local = (Value *)token;
  token_local = (Token *)this;
  for (current = token->start_; (CommentInfo *)current != decoded_local->comments_;
      current = current + 1) {
    local_161 = true;
    if ((bool)inspect._7_1_ == false) {
      bVar1 = Json::in(*current,'.','e','E','+');
      local_161 = true;
      if (!bVar1) {
        local_162 = false;
        if (*current == '-') {
          local_162 = current != *(Location *)&decoded_local->field_0x8;
        }
        local_161 = local_162;
      }
    }
    inspect._7_1_ = local_161;
  }
  if ((bool)inspect._7_1_ == false) {
    pCStack_40 = *(CommentInfo **)&decoded_local->field_0x8;
    maxIntegerValue._7_1_ = *(char *)&pCStack_40->comment_ == '-';
    if ((bool)maxIntegerValue._7_1_) {
      pCStack_40 = (CommentInfo *)((long)&pCStack_40->comment_ + 1);
      local_170 = 0x8000000000000000;
    }
    else {
      local_170 = 0xffffffffffffffff;
    }
    threshold = local_170;
    value = local_170 / 10;
    uStack_60 = 0;
    while (pCStack_40 < decoded_local->comments_) {
      pCVar2 = (CommentInfo *)((long)&pCStack_40->comment_ + 1);
      local_61 = *(char *)&pCStack_40->comment_;
      pCStack_40 = pCVar2;
      if ((local_61 < '0') || ('9' < local_61)) {
        __beg = *(char **)&decoded_local->field_0x8;
        pCVar2 = decoded_local->comments_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  ((string *)&local_c8,__beg,(char *)pCVar2,&local_c9);
        std::operator+(&local_a8,"\'",&local_c8);
        std::operator+(&local_88,&local_a8,"\' is not a number.");
        this_local._7_1_ = addError(this,&local_88,(Token *)decoded_local,(Location)0x0);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
        goto LAB_009d7330;
      }
      local_e0 = (int)local_61 - 0x30;
      if ((value <= uStack_60) &&
         (((value < uStack_60 || (pCVar2 != decoded_local->comments_)) ||
          (local_170 % 10 < (ulong)local_e0)))) {
        this_local._7_1_ = decodeDouble(this,(Token *)decoded_local,pVStack_28);
        goto LAB_009d7330;
      }
      uStack_60 = uStack_60 * 10 + (ulong)local_e0;
    }
    if ((bool)maxIntegerValue._7_1_) {
      Value::Value(&local_108,-uStack_60);
      Value::operator=(pVStack_28,&local_108);
      Value::~Value(&local_108);
    }
    else if (uStack_60 < 0x80000000) {
      Value::Value(&local_130,uStack_60);
      Value::operator=(pVStack_28,&local_130);
      Value::~Value(&local_130);
    }
    else {
      Value::Value(&local_158,uStack_60);
      Value::operator=(pVStack_28,&local_158);
      Value::~Value(&local_158);
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = decodeDouble(this,(Token *)decoded_local,pVStack_28);
  }
LAB_009d7330:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}